

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedPipelineRenderer.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3MaterialBaseCB::OnSetMaterial(COpenGL3MaterialBaseCB *this,SMaterial *material)

{
  long in_RSI;
  long in_RDI;
  undefined4 local_6c;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uStack_50;
  SColor in_stack_ffffffffffffffb4;
  SColor c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_34;
  undefined8 local_2c;
  undefined8 local_20;
  undefined8 local_18;
  
  *(byte *)(in_RDI + 0x34) = (byte)(*(ushort *)(in_RSI + 0xb0) >> 3) & 1;
  SColorf::SColorf((SColorf *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffb4);
  *(undefined8 *)(in_RDI + 0x48) = local_20;
  *(undefined8 *)(in_RDI + 0x50) = local_18;
  SColorf::SColorf((SColorf *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffb4);
  *(undefined8 *)(in_RDI + 0x58) = local_34;
  *(undefined8 *)(in_RDI + 0x60) = local_2c;
  c.color = *(u32 *)(in_RSI + 0x8c);
  SColorf::SColorf((SColorf *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),c);
  *(undefined8 *)(in_RDI + 0x68) = local_48;
  *(undefined8 *)(in_RDI + 0x70) = local_40;
  SColorf::SColorf((SColorf *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),c);
  *(ulong *)(in_RDI + 0x78) = CONCAT44(in_stack_ffffffffffffffa8,local_5c);
  *(ulong *)(in_RDI + 0x80) = CONCAT44(uStack_50,in_stack_ffffffffffffffac);
  *(undefined4 *)(in_RDI + 0x88) = *(undefined4 *)(in_RSI + 0x94);
  *(uint *)(in_RDI + 0x8c) = (uint)((*(ushort *)(in_RSI + 0xb0) & 0x100) != 0);
  if (*(float *)(in_RSI + 0x9c) <= 0.0) {
    local_6c = 0x3f800000;
  }
  else {
    local_6c = *(undefined4 *)(in_RSI + 0x9c);
  }
  *(undefined4 *)(in_RDI + 0xb0) = local_6c;
  return;
}

Assistant:

void COpenGL3MaterialBaseCB::OnSetMaterial(const SMaterial &material)
{
	LightEnable = material.Lighting;
	MaterialAmbient = SColorf(material.AmbientColor);
	MaterialDiffuse = SColorf(material.DiffuseColor);
	MaterialEmissive = SColorf(material.EmissiveColor);
	MaterialSpecular = SColorf(material.SpecularColor);
	MaterialShininess = material.Shininess;

	FogEnable = material.FogEnable ? 1 : 0;

	Thickness = (material.Thickness > 0.f) ? material.Thickness : 1.f;
}